

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeMemGetFileDescriptorFromIpcHandleExp
          (ze_context_handle_t hContext,ze_ipc_mem_handle_t ipcHandle,uint64_t *pHandle)

{
  _func_void__ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _ze_ipc_mem_handle_t _Var2;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_ipc_mem_handle_t_unsigned_long_ptr *p_Var3;
  uint64_t *puVar4;
  char *pcVar5;
  undefined1 *puVar6;
  ulong *puVar7;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_138;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_120;
  undefined1 local_108 [8];
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t epilogue_callback_ptr;
  ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t tracerParams;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ze_pfnMemGetFileDescriptorFromIpcHandleExp_t pfnGetFileDescriptorFromIpcHandleExp;
  uint64_t *pHandle_local;
  ze_context_handle_t hContext_local;
  
  if (_DAT_002da658 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_ipc_mem_handle_t_unsigned_long_ptr *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetFileDescriptorFromIpcHandleExp = (ze_pfnMemGetFileDescriptorFromIpcHandleExp_t)pHandle;
    pHandle_local = (uint64_t *)hContext;
    pcVar5 = (char *)tracingInProgress();
    puVar4 = pHandle_local;
    p_Var3 = _DAT_002da658;
    if (*pcVar5 == '\0') {
      puVar6 = (undefined1 *)tracingInProgress();
      *puVar6 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pHandle_local;
      tracerParams.pipcHandle = (ze_ipc_mem_handle_t *)&pfnGetFileDescriptorFromIpcHandleExp;
      tracerParams.phContext = (ze_context_handle_t *)&ipcHandle;
      APITracerCallbackDataImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar7 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar7 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t)0x0;
            prologueCallbackPtr < (ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t)*puVar7;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar7[1] + (long)prologueCallbackPtr * 0xcb8 + 0x548);
          p_Var1 = *(_func_void__ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar7[1] + (long)prologueCallbackPtr * 0xcb8 + 0xba0);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar7[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_108 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_108
                     );
        }
      }
      p_Var3 = _DAT_002da658;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_120,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_138,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_ipc_mem_handle_t,unsigned_long*),_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,void(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_ipc_mem_handle_t&,unsigned_long*&>
                     (p_Var3,(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t *)
                             &apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_120,&local_138,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_ipc_mem_handle_t *)tracerParams.phContext,
                      (unsigned_long **)tracerParams.pipcHandle);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_138);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_120);
      APITracerCallbackDataImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      memcpy(&tracerParams.ppHandle,&ipcHandle,0x40);
      _Var2.data._8_8_ = uStack_60;
      _Var2.data._0_8_ = tracerParams.ppHandle;
      _Var2.data._16_8_ = local_58;
      _Var2.data._24_8_ = uStack_50;
      _Var2.data._32_8_ = local_48;
      _Var2.data._40_8_ = uStack_40;
      _Var2.data._48_8_ = local_38;
      _Var2.data._56_8_ = uStack_30;
      hContext_local._4_4_ =
           (*p_Var3)((_ze_context_handle_t *)puVar4,_Var2,
                     (unsigned_long *)pfnGetFileDescriptorFromIpcHandleExp);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetFileDescriptorFromIpcHandleExp(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_ipc_mem_handle_t ipcHandle,                  ///< [in] IPC memory handle
        uint64_t* pHandle                               ///< [out] Returned file descriptor
        )
    {
        auto pfnGetFileDescriptorFromIpcHandleExp = context.zeDdiTable.MemExp.pfnGetFileDescriptorFromIpcHandleExp;

        if( nullptr == pfnGetFileDescriptorFromIpcHandleExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.MemExp.pfnGetFileDescriptorFromIpcHandleExp, hContext, ipcHandle, pHandle);

        // capture parameters
        ze_mem_get_file_descriptor_from_ipc_handle_exp_params_t tracerParams = {
            &hContext,
            &ipcHandle,
            &pHandle
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemGetFileDescriptorFromIpcHandleExpCb_t, Mem, pfnGetFileDescriptorFromIpcHandleExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.MemExp.pfnGetFileDescriptorFromIpcHandleExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.pipcHandle,
                                                  *tracerParams.ppHandle);
    }